

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::GetPrototypeAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  Var instance;
  RecyclableObject *pRVar4;
  undefined4 *puVar5;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == GetPrototypeActionTag) {
    instance = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (instance != (Var)0x0) {
      BVar3 = Js::JavascriptOperators::IsObject(instance);
      if (BVar3 != 0) {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(instance);
        if ((((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          instance = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
        }
        pRVar4 = Js::JavascriptOperators::OP_GetPrototype(instance,scriptContext);
        if (pRVar4 != (RecyclableObject *)0x0) {
          BVar3 = Js::CrossSite::NeedMarshalVar(pRVar4,scriptContext);
          if (BVar3 != 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                               ,0x242,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))"
                               ,"res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar5 = 0;
          }
        }
        JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)50>
                  (executeContext,evt,pRVar4);
        return;
      }
    }
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void GetPrototypeAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::Var res = Js::JavascriptOperators::OP_GetPrototype(var,ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetPrototypeActionTag>(executeContext, evt, res);
        }